

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O3

bool vkt::ssbo::anon_unknown_15::compareComponents
               (DataType scalarType,void *ref,void *res,int numComps)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  float fVar6;
  
  if (scalarType == TYPE_FLOAT) {
    if (numComps < 1) {
      return true;
    }
    lVar2 = 0;
    do {
      fVar6 = *(float *)((long)res + lVar2 * 4) - *(float *)((long)ref + lVar2 * 4);
      uVar5 = -(uint)(-fVar6 <= fVar6);
      bVar1 = (float)(~uVar5 & (uint)-fVar6 | (uint)fVar6 & uVar5) < 0.05;
      if (!bVar1) {
        return bVar1;
      }
      bVar3 = (ulong)(uint)numComps - 1 != lVar2;
      lVar2 = lVar2 + 1;
    } while (bVar3);
  }
  else if (scalarType == TYPE_BOOL) {
    if (numComps < 1) {
      return true;
    }
    lVar2 = 0;
    do {
      bVar3 = *(int *)((long)ref + lVar2 * 4) != 0;
      bVar4 = *(int *)((long)res + lVar2 * 4) == 0;
      bVar1 = bVar3 != bVar4;
      if (bVar3 == bVar4) {
        return bVar1;
      }
      bVar3 = (ulong)(uint)numComps - 1 != lVar2;
      lVar2 = lVar2 + 1;
    } while (bVar3);
  }
  else {
    if (numComps < 1) {
      return true;
    }
    lVar2 = 0;
    do {
      bVar1 = *(int *)((long)ref + lVar2 * 4) == *(int *)((long)res + lVar2 * 4);
      if (!bVar1) {
        return bVar1;
      }
      bVar3 = (ulong)(uint)numComps - 1 != lVar2;
      lVar2 = lVar2 + 1;
    } while (bVar3);
  }
  return bVar1;
}

Assistant:

bool compareComponents (glu::DataType scalarType, const void* ref, const void* res, int numComps)
{
	if (scalarType == glu::TYPE_FLOAT)
	{
		const float threshold = 0.05f; // Same as used in shaders - should be fine for values being used.

		for (int ndx = 0; ndx < numComps; ndx++)
		{
			const float		refVal		= *((const float*)ref + ndx);
			const float		resVal		= *((const float*)res + ndx);

			if (deFloatAbs(resVal - refVal) >= threshold)
				return false;
		}
	}
	else if (scalarType == glu::TYPE_BOOL)
	{
		for (int ndx = 0; ndx < numComps; ndx++)
		{
			const deUint32	refVal		= *((const deUint32*)ref + ndx);
			const deUint32	resVal		= *((const deUint32*)res + ndx);

			if ((refVal != 0) != (resVal != 0))
				return false;
		}
	}
	else
	{
		DE_ASSERT(scalarType == glu::TYPE_INT || scalarType == glu::TYPE_UINT);

		for (int ndx = 0; ndx < numComps; ndx++)
		{
			const deUint32	refVal		= *((const deUint32*)ref + ndx);
			const deUint32	resVal		= *((const deUint32*)res + ndx);

			if (refVal != resVal)
				return false;
		}
	}

	return true;
}